

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Individual.cpp
# Opt level: O0

void __thiscall Individual::Individual(Individual *this,int size)

{
  int size_local;
  Individual *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector(&this->coresAsignedToTasks);
  std::shared_ptr<Instance>::shared_ptr(&this->usedInstance);
  std::vector<int,_std::allocator<int>_>::resize(&this->coresAsignedToTasks,(long)size);
  return;
}

Assistant:

Individual::Individual(int size){
	coresAsignedToTasks.resize(size);
}